

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O0

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsUsed(SingleFileBlockManager *this,block_id_t block_id)

{
  bool bVar1;
  iterator this_00;
  long in_RSI;
  SingleFileBlockManager *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98);
  if (in_RSI < in_RDI->max_block) {
    this_00 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::find
                        (in_stack_ffffffffffffffa8,
                         (key_type_conflict2 *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    ::std::set<long,_std::less<long>,_std::allocator<long>_>::end
              ((set<long,_std::less<long>,_std::allocator<long>_> *)this_00._M_node);
    bVar1 = ::std::operator!=((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffb8);
    if (bVar1) {
      ::std::set<long,_std::less<long>,_std::allocator<long>_>::erase
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (key_type_conflict2 *)this_00._M_node);
      ::std::set<long,_std::less<long>,_std::allocator<long>_>::erase
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (key_type_conflict2 *)this_00._M_node);
    }
    else {
      IncreaseBlockReferenceCountInternal(in_RDI,(block_id_t)in_stack_ffffffffffffffa8);
    }
  }
  else {
    while (in_RDI->max_block < in_RSI) {
      ::std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 in_stack_ffffffffffffffc0._M_node,
                 (value_type_conflict5 *)in_stack_ffffffffffffffb8._M_node);
      in_RDI->max_block = in_RDI->max_block + 1;
    }
    in_RDI->max_block = in_RDI->max_block + 1;
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xc5e8e0);
  return;
}

Assistant:

void SingleFileBlockManager::MarkBlockAsUsed(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	if (max_block <= block_id) {
		// the block is past the current max_block
		// in this case we need to increment  "max_block" to "block_id"
		// any blocks in the middle are added to the free list
		// i.e. if max_block = 0, and block_id = 3, we need to add blocks 1 and 2 to the free list
		while (max_block < block_id) {
			free_list.insert(max_block);
			max_block++;
		}
		max_block++;
	} else if (free_list.find(block_id) != free_list.end()) {
		// block is currently in the free list - erase
		free_list.erase(block_id);
		newly_freed_list.erase(block_id);
	} else {
		// block is already in use - increase reference count
		IncreaseBlockReferenceCountInternal(block_id);
	}
}